

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

void __thiscall c4::yml::Tree::set_key_ref(Tree *this,size_t node,csubstr ref)

{
  code *pcVar1;
  bool bVar2;
  NodeData *pNVar3;
  
  pNVar3 = _p(this,node);
  if ((~(int)(pNVar3->m_type).type & 0x102U) == 0) {
    if (((byte)s_error_flags & 1) != 0) {
      bVar2 = is_debugger_attached();
      if (bVar2) {
        pcVar1 = (code *)swi(3);
        (*pcVar1)();
        return;
      }
    }
    to_csubstr(
              "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
              );
    (*(code *)PTR_error_impl_00246018)
              ("check failed: ! has_key_anchor(node)",0x24,
               (anonymous_namespace)::s_default_callbacks);
  }
  pNVar3 = _p(this,node);
  NodeScalar::set_ref_maybe_replacing_scalar
            (&pNVar3->m_key,ref,SUB41((uint)((int)(pNVar3->m_type).type & KEY) >> 1,0));
  _add_flags(this,node,0x42);
  return;
}

Assistant:

void set_key_ref   (size_t node, csubstr ref   ) { RYML_ASSERT( ! has_key_anchor(node)); NodeData* C4_RESTRICT n = _p(node); n->m_key.set_ref_maybe_replacing_scalar(ref, n->m_type.has_key()); _add_flags(node, KEY|KEYREF); }